

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Operation InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)1>::operation(OpT op)

{
  Operation local_9;
  OpT op_local;
  
  local_9 = op;
  if (0x90 < op) {
    switch(op) {
    case 0x91:
    case 0x93:
      local_9 = MOVEPl;
      break;
    case 0x92:
    case 0x94:
      local_9 = MOVEPw;
      break;
    case 0x95:
      local_9 = MOVEl;
      break;
    case 0x96:
      local_9 = ADDb;
      break;
    case 0x97:
      local_9 = ADDw;
      break;
    case 0x98:
      local_9 = ADDl;
      break;
    case 0x99:
      local_9 = ADDAw;
      break;
    case 0x9a:
      local_9 = ADDAl;
      break;
    case 0x9b:
      local_9 = SUBb;
      break;
    case 0x9c:
      local_9 = SUBw;
      break;
    case 0x9d:
      local_9 = SUBl;
      break;
    case 0x9e:
      local_9 = SUBAw;
      break;
    case 0x9f:
      local_9 = SUBAl;
      break;
    case 0xa0:
      local_9 = ADDb;
      break;
    case 0xa1:
      local_9 = ADDw;
      break;
    case 0xa2:
      local_9 = ADDl;
      break;
    case 0xa3:
      local_9 = ORb;
      break;
    case 0xa4:
      local_9 = ORw;
      break;
    case 0xa5:
      local_9 = ORl;
      break;
    case 0xa6:
      local_9 = SUBb;
      break;
    case 0xa7:
      local_9 = SUBw;
      break;
    case 0xa8:
      local_9 = SUBl;
      break;
    case 0xa9:
      local_9 = ANDb;
      break;
    case 0xaa:
      local_9 = ANDw;
      break;
    case 0xab:
      local_9 = ANDl;
      break;
    case 0xac:
      local_9 = EORb;
      break;
    case 0xad:
      local_9 = EORw;
      break;
    case 0xae:
      local_9 = EORl;
      break;
    case 0xaf:
      local_9 = CMPb;
      break;
    case 0xb0:
      local_9 = CMPw;
      break;
    case 0xb1:
      local_9 = CMPl;
      break;
    case 0xb2:
      local_9 = BTST;
      break;
    case 0xb3:
      local_9 = BCHG;
      break;
    case 0xb4:
      local_9 = BCLR;
      break;
    case 0xb5:
      local_9 = BSET;
      break;
    case 0xb6:
      local_9 = CMPb;
      break;
    case 0xb7:
      local_9 = CMPw;
      break;
    case 0xb8:
      local_9 = CMPl;
      break;
    case 0xb9:
    case 0xbc:
      local_9 = ADDb;
      break;
    case 0xba:
    case 0xbd:
      local_9 = ADDw;
      break;
    case 0xbb:
    case 0xbe:
      local_9 = ADDl;
      break;
    case 0xbf:
    case 0xc2:
      local_9 = SUBb;
      break;
    case 0xc0:
    case 0xc3:
      local_9 = SUBw;
      break;
    case 0xc1:
    case 0xc4:
      local_9 = SUBl;
      break;
    case 0xc5:
    case 200:
      local_9 = ANDb;
      break;
    case 0xc6:
    case 0xc9:
      local_9 = ANDw;
      break;
    case 199:
    case 0xca:
      local_9 = ANDl;
      break;
    case 0xcb:
    case 0xce:
      local_9 = ORb;
      break;
    case 0xcc:
    case 0xcf:
      local_9 = ORw;
      break;
    case 0xcd:
    case 0xd0:
      local_9 = ORl;
      break;
    case 0xd1:
    case 0xd2:
    case 0xd3:
      local_9 = EXG;
      break;
    default:
      local_9 = Undefined;
    }
  }
  return local_9;
}

Assistant:

constexpr Operation Predecoder<model>::operation(OpT op) {
	if(op <= OpMax) {
		return Operation(op);
	}

	switch(op) {
		case MOVEPtoRl:	case MOVEPtoMl:	return Operation::MOVEPl;
		case MOVEPtoRw:	case MOVEPtoMw:	return Operation::MOVEPw;

		case ADDQb:		return Operation::ADDb;
		case ADDQw:		return Operation::ADDw;
		case ADDQl:		return Operation::ADDl;
		case ADDQAw:	return Operation::ADDAw;
		case ADDQAl:	return Operation::ADDAl;
		case SUBQb:		return Operation::SUBb;
		case SUBQw:		return Operation::SUBw;
		case SUBQl:		return Operation::SUBl;
		case SUBQAw:	return Operation::SUBAw;
		case SUBQAl:	return Operation::SUBAl;

		case BTSTI:		return Operation::BTST;
		case BCHGI:		return Operation::BCHG;
		case BCLRI:		return Operation::BCLR;
		case BSETI:		return Operation::BSET;

		case CMPMb:		return Operation::CMPb;
		case CMPMw:		return Operation::CMPw;
		case CMPMl:		return Operation::CMPl;

#define ImmediateGroup(x)	\
		case x##Ib:		return Operation::x##b;	\
		case x##Iw:		return Operation::x##w;	\
		case x##Il:		return Operation::x##l;

		ImmediateGroup(ADD)
		ImmediateGroup(SUB);
		ImmediateGroup(OR);
		ImmediateGroup(AND);
		ImmediateGroup(EOR);
		ImmediateGroup(CMP);

#undef ImmediateGroup

		case ADDtoRb:	case ADDtoMb:	return Operation::ADDb;
		case ADDtoRw:	case ADDtoMw:	return Operation::ADDw;
		case ADDtoRl:	case ADDtoMl:	return Operation::ADDl;

		case SUBtoRb:	case SUBtoMb:	return Operation::SUBb;
		case SUBtoRw:	case SUBtoMw:	return Operation::SUBw;
		case SUBtoRl:	case SUBtoMl:	return Operation::SUBl;

		case ANDtoRb:	case ANDtoMb:	return Operation::ANDb;
		case ANDtoRw:	case ANDtoMw:	return Operation::ANDw;
		case ANDtoRl:	case ANDtoMl:	return Operation::ANDl;

		case ORtoRb:	case ORtoMb:	return Operation::ORb;
		case ORtoRw:	case ORtoMw:	return Operation::ORw;
		case ORtoRl:	case ORtoMl:	return Operation::ORl;

		case EXGRtoR:	case EXGAtoA:	case EXGRtoA:	return Operation::EXG;

		case MOVEQ:		return Operation::MOVEl;

		default: break;
	}

	return Operation::Undefined;
}